

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O1

Clause * __thiscall Inferences::CompositeISE::simplify(CompositeISE *this,Clause *cl)

{
  int iVar1;
  undefined4 extraout_var;
  ISList *pIVar2;
  
  if (cl != (Clause *)0x0) {
    for (pIVar2 = this->_inners; pIVar2 != (ISList *)0x0; pIVar2 = pIVar2->_tail) {
      iVar1 = (*(pIVar2->_head->super_InferenceEngine)._vptr_InferenceEngine[6])(pIVar2->_head,cl);
      if ((Clause *)CONCAT44(extraout_var,iVar1) != cl) {
        return (Clause *)CONCAT44(extraout_var,iVar1);
      }
    }
  }
  return cl;
}

Assistant:

Clause* CompositeISE::simplify(Clause* cl)
{
  ISList* curr=_inners;
  while(curr && cl) {
    Clause* newCl=curr->head()->simplify(cl);
    if(newCl==cl) {
      curr=curr->tail();
    } else {
      return newCl;
    }
  }
  return cl;
}